

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  RTCIntersectArguments *pRVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined4 uVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  bool bVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  AABBNodeMB4D *node1;
  ulong uVar101;
  ulong uVar102;
  long lVar103;
  int iVar104;
  long lVar105;
  uint uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  long lVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  ulong uVar115;
  long lVar116;
  undefined4 uVar117;
  ulong unaff_R13;
  size_t mask;
  ulong uVar118;
  ulong uVar119;
  ulong uVar120;
  bool bVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  float fVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  float fVar175;
  undefined1 auVar171 [32];
  float fVar173;
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [64];
  undefined1 auVar179 [32];
  uint uVar181;
  uint uVar182;
  uint uVar183;
  uint uVar184;
  uint uVar185;
  uint uVar186;
  uint uVar187;
  undefined1 auVar180 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  float fVar191;
  undefined1 auVar192 [16];
  float fVar197;
  undefined1 auVar193 [32];
  float fVar195;
  float fVar196;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar194 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [244];
  int local_cec;
  ulong local_ce8;
  ulong local_ce0;
  ulong local_cd8;
  ulong local_cd0;
  ulong local_cc8;
  ulong local_cc0;
  ulong local_cb8;
  ulong *local_cb0;
  Scene *local_ca8;
  undefined1 local_ca0 [32];
  ulong local_c78;
  long local_c70;
  ulong local_c68;
  ulong local_c60;
  ulong local_c58;
  ulong local_c50;
  ulong local_c48;
  float local_c40;
  float local_c3c;
  float local_c38;
  float local_c34;
  float local_c30;
  undefined4 local_c2c;
  uint local_c28;
  uint local_c24;
  uint local_c20;
  RTCFilterFunctionNArguments local_c10;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 local_ad0 [8];
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined4 uStack_9e4;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800;
  ulong local_7f8 [249];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar127 = ray->tfar;
    auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar127) {
      local_cb0 = local_7f8;
      local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar4 = (ray->dir).field_0;
      auVar129 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar123._8_4_ = 0x7fffffff;
      auVar123._0_8_ = 0x7fffffff7fffffff;
      auVar123._12_4_ = 0x7fffffff;
      auVar123 = vandps_avx((undefined1  [16])aVar4,auVar123);
      auVar156._8_4_ = 0x219392ef;
      auVar156._0_8_ = 0x219392ef219392ef;
      auVar156._12_4_ = 0x219392ef;
      auVar123 = vcmpps_avx(auVar123,auVar156,1);
      auVar123 = vblendvps_avx((undefined1  [16])aVar4,auVar156,auVar123);
      auVar156 = vrcpps_avx(auVar123);
      fVar136 = auVar156._0_4_;
      auVar142._0_4_ = fVar136 * auVar123._0_4_;
      fVar138 = auVar156._4_4_;
      auVar142._4_4_ = fVar138 * auVar123._4_4_;
      fVar139 = auVar156._8_4_;
      auVar142._8_4_ = fVar139 * auVar123._8_4_;
      fVar140 = auVar156._12_4_;
      auVar142._12_4_ = fVar140 * auVar123._12_4_;
      auVar157._8_4_ = 0x3f800000;
      auVar157._0_8_ = &DAT_3f8000003f800000;
      auVar157._12_4_ = 0x3f800000;
      auVar123 = vsubps_avx(auVar157,auVar142);
      auVar143._0_4_ = fVar136 + fVar136 * auVar123._0_4_;
      auVar143._4_4_ = fVar138 + fVar138 * auVar123._4_4_;
      auVar143._8_4_ = fVar139 + fVar139 * auVar123._8_4_;
      auVar143._12_4_ = fVar140 + fVar140 * auVar123._12_4_;
      uVar117 = *(undefined4 *)&(ray->org).field_0;
      local_b50._4_4_ = uVar117;
      local_b50._0_4_ = uVar117;
      local_b50._8_4_ = uVar117;
      local_b50._12_4_ = uVar117;
      auVar165 = ZEXT1664(local_b50);
      uVar117 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_b60._4_4_ = uVar117;
      local_b60._0_4_ = uVar117;
      local_b60._8_4_ = uVar117;
      local_b60._12_4_ = uVar117;
      auVar167 = ZEXT1664(local_b60);
      uVar117 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_b70._4_4_ = uVar117;
      local_b70._0_4_ = uVar117;
      local_b70._8_4_ = uVar117;
      local_b70._12_4_ = uVar117;
      auVar172 = ZEXT1664(local_b70);
      local_b80 = vshufps_avx(auVar143,auVar143,0);
      auVar180 = ZEXT1664(local_b80);
      auVar123 = vmovshdup_avx(auVar143);
      local_b90 = vshufps_avx(auVar143,auVar143,0x55);
      auVar189 = ZEXT1664(local_b90);
      auVar156 = vshufpd_avx(auVar143,auVar143,1);
      local_ba0 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar190 = ZEXT1664(local_ba0);
      uVar108 = (ulong)(auVar143._0_4_ < 0.0) << 4;
      uVar110 = (ulong)(auVar123._0_4_ < 0.0) << 4 | 0x20;
      uVar112 = (ulong)(auVar156._0_4_ < 0.0) << 4 | 0x40;
      uVar114 = uVar108 ^ 0x10;
      uVar109 = uVar110 ^ 0x10;
      uVar120 = uVar112 ^ 0x10;
      local_bb0 = vshufps_avx(auVar129,auVar129,0);
      auVar194 = ZEXT1664(local_bb0);
      local_bc0 = vshufps_avx(ZEXT416((uint)fVar127),ZEXT416((uint)fVar127),0);
      auVar202 = ZEXT1664(local_bc0);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._240_16_;
      local_9e0 = vperm2f128_avx(local_a20,mm_lookupmask_ps._0_32_,2);
      auVar125._8_4_ = 0xbf800000;
      auVar125._0_8_ = 0xbf800000bf800000;
      auVar125._12_4_ = 0xbf800000;
      auVar125._16_4_ = 0xbf800000;
      auVar125._20_4_ = 0xbf800000;
      auVar125._24_4_ = 0xbf800000;
      auVar125._28_4_ = 0xbf800000;
      auVar149._8_4_ = 0x3f800000;
      auVar149._0_8_ = &DAT_3f8000003f800000;
      auVar149._12_4_ = 0x3f800000;
      auVar149._16_4_ = 0x3f800000;
      auVar149._20_4_ = 0x3f800000;
      auVar149._24_4_ = 0x3f800000;
      auVar149._28_4_ = 0x3f800000;
      _local_a00 = vblendvps_avx(auVar149,auVar125,local_9e0);
      local_cc0 = uVar108;
      local_cc8 = uVar110;
      local_cd0 = uVar112;
      local_cd8 = uVar114;
      local_ce0 = uVar109;
      local_ce8 = uVar120;
      do {
        if (local_cb0 == &local_800) {
          return;
        }
        uVar119 = local_cb0[-1];
        local_cb0 = local_cb0 + -1;
        local_cb8 = unaff_R13;
        do {
          if ((uVar119 & 8) == 0) {
            uVar101 = uVar119 & 0xfffffffffffffff0;
            fVar127 = (ray->dir).field_0.m128[3];
            auVar122._4_4_ = fVar127;
            auVar122._0_4_ = fVar127;
            auVar122._8_4_ = fVar127;
            auVar122._12_4_ = fVar127;
            pfVar2 = (float *)(uVar101 + 0x80 + uVar108);
            pfVar1 = (float *)(uVar101 + 0x20 + uVar108);
            auVar129._0_4_ = fVar127 * *pfVar2 + *pfVar1;
            auVar129._4_4_ = fVar127 * pfVar2[1] + pfVar1[1];
            auVar129._8_4_ = fVar127 * pfVar2[2] + pfVar1[2];
            auVar129._12_4_ = fVar127 * pfVar2[3] + pfVar1[3];
            auVar123 = vsubps_avx(auVar129,auVar165._0_16_);
            auVar128._0_4_ = auVar180._0_4_ * auVar123._0_4_;
            auVar128._4_4_ = auVar180._4_4_ * auVar123._4_4_;
            auVar128._8_4_ = auVar180._8_4_ * auVar123._8_4_;
            auVar128._12_4_ = auVar180._12_4_ * auVar123._12_4_;
            auVar123 = vmaxps_avx(auVar194._0_16_,auVar128);
            pfVar2 = (float *)(uVar101 + 0x80 + uVar110);
            pfVar1 = (float *)(uVar101 + 0x20 + uVar110);
            auVar144._0_4_ = fVar127 * *pfVar2 + *pfVar1;
            auVar144._4_4_ = fVar127 * pfVar2[1] + pfVar1[1];
            auVar144._8_4_ = fVar127 * pfVar2[2] + pfVar1[2];
            auVar144._12_4_ = fVar127 * pfVar2[3] + pfVar1[3];
            auVar129 = vsubps_avx(auVar144,auVar167._0_16_);
            auVar145._0_4_ = auVar189._0_4_ * auVar129._0_4_;
            auVar145._4_4_ = auVar189._4_4_ * auVar129._4_4_;
            auVar145._8_4_ = auVar189._8_4_ * auVar129._8_4_;
            auVar145._12_4_ = auVar189._12_4_ * auVar129._12_4_;
            pfVar2 = (float *)(uVar101 + 0x80 + uVar112);
            pfVar1 = (float *)(uVar101 + 0x20 + uVar112);
            auVar152._0_4_ = fVar127 * *pfVar2 + *pfVar1;
            auVar152._4_4_ = fVar127 * pfVar2[1] + pfVar1[1];
            auVar152._8_4_ = fVar127 * pfVar2[2] + pfVar1[2];
            auVar152._12_4_ = fVar127 * pfVar2[3] + pfVar1[3];
            auVar129 = vsubps_avx(auVar152,auVar172._0_16_);
            auVar153._0_4_ = auVar190._0_4_ * auVar129._0_4_;
            auVar153._4_4_ = auVar190._4_4_ * auVar129._4_4_;
            auVar153._8_4_ = auVar190._8_4_ * auVar129._8_4_;
            auVar153._12_4_ = auVar190._12_4_ * auVar129._12_4_;
            auVar129 = vmaxps_avx(auVar145,auVar153);
            auVar123 = vmaxps_avx(auVar123,auVar129);
            pfVar2 = (float *)(uVar101 + 0x80 + uVar114);
            pfVar1 = (float *)(uVar101 + 0x20 + uVar114);
            auVar146._0_4_ = fVar127 * *pfVar2 + *pfVar1;
            auVar146._4_4_ = fVar127 * pfVar2[1] + pfVar1[1];
            auVar146._8_4_ = fVar127 * pfVar2[2] + pfVar1[2];
            auVar146._12_4_ = fVar127 * pfVar2[3] + pfVar1[3];
            auVar129 = vsubps_avx(auVar146,auVar165._0_16_);
            auVar147._0_4_ = auVar180._0_4_ * auVar129._0_4_;
            auVar147._4_4_ = auVar180._4_4_ * auVar129._4_4_;
            auVar147._8_4_ = auVar180._8_4_ * auVar129._8_4_;
            auVar147._12_4_ = auVar180._12_4_ * auVar129._12_4_;
            pfVar2 = (float *)(uVar101 + 0x80 + uVar109);
            auVar129 = vminps_avx(auVar202._0_16_,auVar147);
            pfVar1 = (float *)(uVar101 + 0x20 + uVar109);
            auVar154._0_4_ = fVar127 * *pfVar2 + *pfVar1;
            auVar154._4_4_ = fVar127 * pfVar2[1] + pfVar1[1];
            auVar154._8_4_ = fVar127 * pfVar2[2] + pfVar1[2];
            auVar154._12_4_ = fVar127 * pfVar2[3] + pfVar1[3];
            auVar156 = vsubps_avx(auVar154,auVar167._0_16_);
            pfVar2 = (float *)(uVar101 + 0x80 + uVar120);
            pfVar1 = (float *)(uVar101 + 0x20 + uVar120);
            auVar158._0_4_ = fVar127 * *pfVar2 + *pfVar1;
            auVar158._4_4_ = fVar127 * pfVar2[1] + pfVar1[1];
            auVar158._8_4_ = fVar127 * pfVar2[2] + pfVar1[2];
            auVar158._12_4_ = fVar127 * pfVar2[3] + pfVar1[3];
            auVar155._0_4_ = auVar189._0_4_ * auVar156._0_4_;
            auVar155._4_4_ = auVar189._4_4_ * auVar156._4_4_;
            auVar155._8_4_ = auVar189._8_4_ * auVar156._8_4_;
            auVar155._12_4_ = auVar189._12_4_ * auVar156._12_4_;
            auVar156 = vsubps_avx(auVar158,auVar172._0_16_);
            auVar159._0_4_ = auVar190._0_4_ * auVar156._0_4_;
            auVar159._4_4_ = auVar190._4_4_ * auVar156._4_4_;
            auVar159._8_4_ = auVar190._8_4_ * auVar156._8_4_;
            auVar159._12_4_ = auVar190._12_4_ * auVar156._12_4_;
            auVar156 = vminps_avx(auVar155,auVar159);
            auVar129 = vminps_avx(auVar129,auVar156);
            if (((uint)uVar119 & 7) == 6) {
              auVar129 = vcmpps_avx(auVar123,auVar129,2);
              auVar123 = vcmpps_avx(*(undefined1 (*) [16])(uVar101 + 0xe0),auVar122,2);
              auVar156 = vcmpps_avx(auVar122,*(undefined1 (*) [16])(uVar101 + 0xf0),1);
              auVar123 = vandps_avx(auVar123,auVar156);
              auVar123 = vandps_avx(auVar123,auVar129);
            }
            else {
              auVar123 = vcmpps_avx(auVar123,auVar129,2);
            }
            auVar123 = vpslld_avx(auVar123,0x1f);
            uVar117 = vmovmskps_avx(auVar123);
            local_cb8 = CONCAT44((int)(local_cb8 >> 0x20),uVar117);
          }
          if ((uVar119 & 8) == 0) {
            if (local_cb8 == 0) {
              iVar104 = 4;
            }
            else {
              uVar101 = uVar119 & 0xfffffffffffffff0;
              lVar105 = 0;
              if (local_cb8 != 0) {
                for (; (local_cb8 >> lVar105 & 1) == 0; lVar105 = lVar105 + 1) {
                }
              }
              iVar104 = 0;
              uVar119 = *(ulong *)(uVar101 + lVar105 * 8);
              uVar107 = local_cb8 - 1 & local_cb8;
              if (uVar107 != 0) {
                *local_cb0 = uVar119;
                lVar105 = 0;
                if (uVar107 != 0) {
                  for (; (uVar107 >> lVar105 & 1) == 0; lVar105 = lVar105 + 1) {
                  }
                }
                uVar102 = uVar107 - 1;
                while( true ) {
                  local_cb0 = local_cb0 + 1;
                  uVar119 = *(ulong *)(uVar101 + lVar105 * 8);
                  uVar102 = uVar102 & uVar107;
                  if (uVar102 == 0) break;
                  *local_cb0 = uVar119;
                  lVar105 = 0;
                  if (uVar102 != 0) {
                    for (; (uVar102 >> lVar105 & 1) == 0; lVar105 = lVar105 + 1) {
                    }
                  }
                  uVar107 = uVar102 - 1;
                }
                iVar104 = 0;
              }
            }
          }
          else {
            iVar104 = 6;
          }
        } while (iVar104 == 0);
        if (iVar104 == 6) {
          iVar104 = 0;
          local_c78 = (ulong)((uint)uVar119 & 0xf) - 8;
          bVar121 = local_c78 != 0;
          if (bVar121) {
            uVar119 = uVar119 & 0xfffffffffffffff0;
            local_ca8 = context->scene;
            uVar109 = 0;
            do {
              local_c48 = uVar109;
              lVar103 = uVar109 * 0x60;
              pRVar5 = (local_ca8->geometries).items;
              pGVar6 = pRVar5[*(uint *)(uVar119 + 0x40 + lVar103)].ptr;
              fVar127 = (pGVar6->time_range).lower;
              fVar127 = pGVar6->fnumTimeSegments *
                        (((ray->dir).field_0.m128[3] - fVar127) /
                        ((pGVar6->time_range).upper - fVar127));
              auVar123 = vroundss_avx(ZEXT416((uint)fVar127),ZEXT416((uint)fVar127),9);
              auVar123 = vminss_avx(auVar123,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
              auVar152 = vmaxss_avx(auVar163._0_16_,auVar123);
              iVar104 = (int)auVar152._0_4_;
              lVar111 = (long)iVar104 * 0x38;
              lVar105 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar111);
              local_c60 = (ulong)*(uint *)(uVar119 + 4 + lVar103);
              auVar123 = *(undefined1 (*) [16])(lVar105 + (ulong)*(uint *)(uVar119 + lVar103) * 4);
              uVar110 = (ulong)*(uint *)(uVar119 + 0x10 + lVar103);
              auVar129 = *(undefined1 (*) [16])(lVar105 + uVar110 * 4);
              uVar112 = (ulong)*(uint *)(uVar119 + 0x20 + lVar103);
              auVar156 = *(undefined1 (*) [16])(lVar105 + uVar112 * 4);
              uVar114 = (ulong)*(uint *)(uVar119 + 0x30 + lVar103);
              auVar142 = *(undefined1 (*) [16])(lVar105 + uVar114 * 4);
              local_c70 = *(long *)&pRVar5[*(uint *)(uVar119 + 0x44 + lVar103)].ptr[2].numPrimitives
              ;
              lVar105 = *(long *)(local_c70 + lVar111);
              auVar143 = *(undefined1 (*) [16])(lVar105 + local_c60 * 4);
              local_c50 = (ulong)*(uint *)(uVar119 + 0x14 + lVar103);
              auVar157 = *(undefined1 (*) [16])(lVar105 + local_c50 * 4);
              uVar120 = (ulong)*(uint *)(uVar119 + 0x24 + lVar103);
              auVar122 = *(undefined1 (*) [16])(lVar105 + uVar120 * 4);
              uVar101 = (ulong)*(uint *)(uVar119 + 0x34 + lVar103);
              auVar128 = *(undefined1 (*) [16])(lVar105 + uVar101 * 4);
              lVar105 = *(long *)&pRVar5[*(uint *)(uVar119 + 0x48 + lVar103)].ptr[2].numPrimitives;
              lVar7 = *(long *)(lVar105 + lVar111);
              uVar107 = (ulong)*(uint *)(uVar119 + 8 + lVar103);
              auVar144 = *(undefined1 (*) [16])(lVar7 + uVar107 * 4);
              uVar118 = (ulong)*(uint *)(uVar119 + 0x18 + lVar103);
              auVar145 = *(undefined1 (*) [16])(lVar7 + uVar118 * 4);
              local_c68 = (ulong)*(uint *)(uVar119 + 0x28 + lVar103);
              auVar146 = *(undefined1 (*) [16])(lVar7 + local_c68 * 4);
              local_c58 = (ulong)*(uint *)(uVar119 + 0x38 + lVar103);
              auVar147 = *(undefined1 (*) [16])(lVar7 + local_c58 * 4);
              fVar127 = fVar127 - auVar152._0_4_;
              local_a30 = ZEXT416((uint)fVar127);
              lVar7 = *(long *)&pRVar5[*(uint *)(uVar119 + 0x4c + lVar103)].ptr[2].numPrimitives;
              lVar111 = *(long *)(lVar7 + lVar111);
              uVar108 = (ulong)*(uint *)(uVar119 + 0xc + lVar103);
              auVar152 = *(undefined1 (*) [16])(lVar111 + uVar108 * 4);
              uVar115 = (ulong)*(uint *)(uVar119 + 0x1c + lVar103);
              auVar153 = *(undefined1 (*) [16])(lVar111 + uVar115 * 4);
              auVar154 = vunpcklps_avx(auVar123,auVar144);
              auVar144 = vunpckhps_avx(auVar123,auVar144);
              auVar155 = vunpcklps_avx(auVar143,auVar152);
              auVar143 = vunpckhps_avx(auVar143,auVar152);
              uVar102 = (ulong)*(uint *)(uVar119 + 0x2c + lVar103);
              auVar123 = *(undefined1 (*) [16])(lVar111 + uVar102 * 4);
              _local_a50 = vunpcklps_avx(auVar144,auVar143);
              auVar99 = _local_a50;
              _local_a90 = vunpcklps_avx(auVar154,auVar155);
              auVar95 = _local_a90;
              _local_a70 = vunpckhps_avx(auVar154,auVar155);
              auVar97 = _local_a70;
              auVar144 = vunpcklps_avx(auVar129,auVar145);
              auVar143 = vunpckhps_avx(auVar129,auVar145);
              auVar145 = vunpcklps_avx(auVar157,auVar153);
              auVar157 = vunpckhps_avx(auVar157,auVar153);
              uVar113 = (ulong)*(uint *)(uVar119 + 0x3c + lVar103);
              auVar129 = *(undefined1 (*) [16])(lVar111 + uVar113 * 4);
              _local_a40 = vunpcklps_avx(auVar143,auVar157);
              auVar100 = _local_a40;
              _local_a80 = vunpcklps_avx(auVar144,auVar145);
              auVar96 = _local_a80;
              _local_a60 = vunpckhps_avx(auVar144,auVar145);
              auVar98 = _local_a60;
              auVar157 = vunpcklps_avx(auVar156,auVar146);
              auVar156 = vunpckhps_avx(auVar156,auVar146);
              auVar144 = vunpcklps_avx(auVar122,auVar123);
              auVar143 = vunpckhps_avx(auVar122,auVar123);
              lVar116 = (long)(iVar104 + 1) * 0x38;
              lVar111 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar116);
              auVar123 = *(undefined1 (*) [16])(lVar111 + (ulong)*(uint *)(uVar119 + lVar103) * 4);
              _local_aa0 = vunpcklps_avx(auVar156,auVar143);
              auVar94 = _local_aa0;
              _local_ae0 = vunpcklps_avx(auVar157,auVar144);
              auVar159 = _local_ae0;
              _local_ac0 = vunpckhps_avx(auVar157,auVar144);
              auVar92 = _local_ac0;
              auVar143 = vunpcklps_avx(auVar142,auVar147);
              auVar156 = vunpckhps_avx(auVar142,auVar147);
              auVar157 = vunpcklps_avx(auVar128,auVar129);
              auVar142 = vunpckhps_avx(auVar128,auVar129);
              lVar105 = *(long *)(lVar105 + lVar116);
              auVar129 = *(undefined1 (*) [16])(lVar105 + uVar107 * 4);
              _local_ab0 = vunpcklps_avx(auVar156,auVar142);
              auVar93 = _local_ab0;
              auVar122 = vunpcklps_avx(auVar143,auVar157);
              _local_ad0 = vunpckhps_avx(auVar143,auVar157);
              auVar91 = _local_ad0;
              lVar8 = *(long *)(local_c70 + lVar116);
              auVar142 = vunpcklps_avx(auVar123,auVar129);
              auVar156 = vunpckhps_avx(auVar123,auVar129);
              auVar123 = *(undefined1 (*) [16])(lVar8 + local_c60 * 4);
              lVar7 = *(long *)(lVar7 + lVar116);
              auVar129 = *(undefined1 (*) [16])(lVar7 + uVar108 * 4);
              auVar143 = vunpcklps_avx(auVar123,auVar129);
              auVar123 = vunpckhps_avx(auVar123,auVar129);
              auVar128 = vunpcklps_avx(auVar156,auVar123);
              auVar144 = vunpcklps_avx(auVar142,auVar143);
              auVar156 = vunpckhps_avx(auVar142,auVar143);
              auVar123 = *(undefined1 (*) [16])(lVar111 + uVar110 * 4);
              auVar129 = *(undefined1 (*) [16])(lVar105 + uVar118 * 4);
              auVar143 = vunpcklps_avx(auVar123,auVar129);
              auVar142 = vunpckhps_avx(auVar123,auVar129);
              auVar123 = *(undefined1 (*) [16])(lVar8 + local_c50 * 4);
              auVar129 = *(undefined1 (*) [16])(lVar7 + uVar115 * 4);
              auVar157 = vunpcklps_avx(auVar123,auVar129);
              auVar123 = vunpckhps_avx(auVar123,auVar129);
              auVar145 = vunpcklps_avx(auVar142,auVar123);
              auVar146 = vunpcklps_avx(auVar143,auVar157);
              auVar142 = vunpckhps_avx(auVar143,auVar157);
              auVar123 = *(undefined1 (*) [16])(lVar111 + uVar112 * 4);
              auVar129 = *(undefined1 (*) [16])(lVar105 + local_c68 * 4);
              auVar157 = vunpcklps_avx(auVar123,auVar129);
              auVar143 = vunpckhps_avx(auVar123,auVar129);
              auVar123 = *(undefined1 (*) [16])(lVar8 + uVar120 * 4);
              auVar129 = *(undefined1 (*) [16])(lVar7 + uVar102 * 4);
              auVar147 = vunpcklps_avx(auVar123,auVar129);
              auVar123 = vunpckhps_avx(auVar123,auVar129);
              auVar152 = vunpcklps_avx(auVar143,auVar123);
              auVar153 = vunpcklps_avx(auVar157,auVar147);
              auVar143 = vunpckhps_avx(auVar157,auVar147);
              auVar123 = *(undefined1 (*) [16])(lVar111 + uVar114 * 4);
              auVar129 = *(undefined1 (*) [16])(lVar105 + local_c58 * 4);
              auVar147 = vunpcklps_avx(auVar123,auVar129);
              auVar157 = vunpckhps_avx(auVar123,auVar129);
              auVar123 = *(undefined1 (*) [16])(lVar8 + uVar101 * 4);
              auVar129 = *(undefined1 (*) [16])(lVar7 + uVar113 * 4);
              auVar154 = vunpcklps_avx(auVar123,auVar129);
              auVar123 = vunpckhps_avx(auVar123,auVar129);
              auVar155 = vunpcklps_avx(auVar157,auVar123);
              auVar158 = vunpcklps_avx(auVar147,auVar154);
              auVar157 = vunpckhps_avx(auVar147,auVar154);
              auVar123 = vshufps_avx(local_a30,local_a30,0);
              auVar129 = ZEXT416((uint)(1.0 - fVar127));
              auVar129 = vshufps_avx(auVar129,auVar129,0);
              fVar127 = auVar123._0_4_;
              fVar136 = auVar123._4_4_;
              fVar138 = auVar123._8_4_;
              fVar139 = auVar123._12_4_;
              fVar140 = auVar129._0_4_;
              fVar141 = auVar129._4_4_;
              fVar135 = auVar129._8_4_;
              fVar137 = auVar129._12_4_;
              auVar160._4_4_ = fVar141 * (float)local_a90._4_4_ + auVar144._4_4_ * fVar136;
              auVar160._0_4_ = fVar140 * (float)local_a90._0_4_ + auVar144._0_4_ * fVar127;
              auVar160._8_4_ = fVar135 * fStack_a88 + auVar144._8_4_ * fVar138;
              auVar160._12_4_ = fVar137 * fStack_a84 + auVar144._12_4_ * fVar139;
              auVar162._4_4_ = fVar141 * (float)local_a70._4_4_ + auVar156._4_4_ * fVar136;
              auVar162._0_4_ = fVar140 * (float)local_a70._0_4_ + auVar156._0_4_ * fVar127;
              auVar162._8_4_ = fVar135 * fStack_a68 + auVar156._8_4_ * fVar138;
              auVar162._12_4_ = fVar137 * fStack_a64 + auVar156._12_4_ * fVar139;
              auVar166._4_4_ = fVar141 * (float)local_a50._4_4_ + auVar128._4_4_ * fVar136;
              auVar166._0_4_ = fVar140 * (float)local_a50._0_4_ + auVar128._0_4_ * fVar127;
              auVar166._8_4_ = fVar135 * fStack_a48 + auVar128._8_4_ * fVar138;
              auVar166._12_4_ = fVar137 * fStack_a44 + auVar128._12_4_ * fVar139;
              auVar169._0_4_ = fVar140 * (float)local_a80._0_4_ + fVar127 * auVar146._0_4_;
              auVar169._4_4_ = fVar141 * (float)local_a80._4_4_ + fVar136 * auVar146._4_4_;
              auVar169._8_4_ = fVar135 * fStack_a78 + fVar138 * auVar146._8_4_;
              auVar169._12_4_ = fVar137 * fStack_a74 + fVar139 * auVar146._12_4_;
              auVar148._0_4_ = fVar140 * (float)local_a60._0_4_ + fVar127 * auVar142._0_4_;
              auVar148._4_4_ = fVar141 * (float)local_a60._4_4_ + fVar136 * auVar142._4_4_;
              auVar148._8_4_ = fVar135 * fStack_a58 + fVar138 * auVar142._8_4_;
              auVar148._12_4_ = fVar137 * fStack_a54 + fVar139 * auVar142._12_4_;
              auVar203._0_4_ = fVar140 * (float)local_a40._0_4_ + auVar145._0_4_ * fVar127;
              auVar203._4_4_ = fVar141 * (float)local_a40._4_4_ + auVar145._4_4_ * fVar136;
              auVar203._8_4_ = fVar135 * fStack_a38 + auVar145._8_4_ * fVar138;
              auVar203._12_4_ = fVar137 * fStack_a34 + auVar145._12_4_ * fVar139;
              auVar160._20_4_ = fVar141 * (float)local_ae0._4_4_ + fVar136 * auVar153._4_4_;
              auVar160._16_4_ = fVar140 * (float)local_ae0._0_4_ + fVar127 * auVar153._0_4_;
              auVar160._24_4_ = fVar135 * fStack_ad8 + fVar138 * auVar153._8_4_;
              auVar160._28_4_ = fVar137 * fStack_ad4 + fVar139 * auVar153._12_4_;
              auVar162._20_4_ = fVar141 * (float)local_ac0._4_4_ + auVar143._4_4_ * fVar136;
              auVar162._16_4_ = fVar140 * (float)local_ac0._0_4_ + auVar143._0_4_ * fVar127;
              auVar162._24_4_ = fVar135 * fStack_ab8 + auVar143._8_4_ * fVar138;
              auVar162._28_4_ = fVar137 * fStack_ab4 + auVar143._12_4_ * fVar139;
              auVar166._20_4_ = fVar141 * (float)local_aa0._4_4_ + auVar152._4_4_ * fVar136;
              auVar166._16_4_ = fVar140 * (float)local_aa0._0_4_ + auVar152._0_4_ * fVar127;
              auVar166._24_4_ = fVar135 * fStack_a98 + auVar152._8_4_ * fVar138;
              auVar166._28_4_ = fVar137 * fStack_a94 + auVar152._12_4_ * fVar139;
              auVar205._0_4_ = auVar122._0_4_ * fVar140 + fVar127 * auVar158._0_4_;
              auVar205._4_4_ = auVar122._4_4_ * fVar141 + fVar136 * auVar158._4_4_;
              auVar205._8_4_ = auVar122._8_4_ * fVar135 + fVar138 * auVar158._8_4_;
              auVar205._12_4_ = auVar122._12_4_ * fVar137 + fVar139 * auVar158._12_4_;
              lVar105 = uVar119 + 0x40 + lVar103;
              local_9a0 = *(undefined8 *)(lVar105 + 0x10);
              uStack_998 = *(undefined8 *)(lVar105 + 0x18);
              uStack_990 = local_9a0;
              uStack_988 = uStack_998;
              lVar103 = uVar119 + 0x50 + lVar103;
              local_9c0 = *(undefined8 *)(lVar103 + 0x10);
              uStack_9b8 = *(undefined8 *)(lVar103 + 0x18);
              auVar192._0_4_ = fVar140 * (float)local_ad0._0_4_ + fVar127 * auVar157._0_4_;
              auVar192._4_4_ = fVar141 * (float)local_ad0._4_4_ + fVar136 * auVar157._4_4_;
              auVar192._8_4_ = fVar135 * fStack_ac8 + fVar138 * auVar157._8_4_;
              auVar192._12_4_ = fVar137 * fStack_ac4 + fVar139 * auVar157._12_4_;
              auVar124._0_4_ = fVar140 * (float)local_ab0._0_4_ + fVar127 * auVar155._0_4_;
              auVar124._4_4_ = fVar141 * (float)local_ab0._4_4_ + fVar136 * auVar155._4_4_;
              auVar124._8_4_ = fVar135 * fStack_aa8 + fVar138 * auVar155._8_4_;
              auVar124._12_4_ = fVar137 * fStack_aa4 + fVar139 * auVar155._12_4_;
              uStack_9b0 = local_9c0;
              uStack_9a8 = uStack_9b8;
              auVar130._16_16_ = auVar169;
              auVar130._0_16_ = auVar169;
              auVar150._16_16_ = auVar148;
              auVar150._0_16_ = auVar148;
              auVar170._16_16_ = auVar203;
              auVar170._0_16_ = auVar203;
              auVar179._16_16_ = auVar205;
              auVar179._0_16_ = auVar205;
              auVar188._16_16_ = auVar192;
              auVar188._0_16_ = auVar192;
              auVar126._16_16_ = auVar124;
              auVar126._0_16_ = auVar124;
              local_ca0 = vsubps_avx(auVar160,auVar130);
              local_be0 = vsubps_avx(auVar162,auVar150);
              auVar125 = vsubps_avx(auVar166,auVar170);
              auVar149 = vsubps_avx(auVar179,auVar160);
              auVar130 = vsubps_avx(auVar188,auVar162);
              auVar126 = vsubps_avx(auVar126,auVar166);
              fVar139 = auVar126._0_4_;
              fVar191 = local_be0._0_4_;
              fVar14 = auVar126._4_4_;
              fVar195 = local_be0._4_4_;
              auVar74._4_4_ = fVar195 * fVar14;
              auVar74._0_4_ = fVar191 * fVar139;
              fVar24 = auVar126._8_4_;
              fVar196 = local_be0._8_4_;
              auVar74._8_4_ = fVar196 * fVar24;
              fVar34 = auVar126._12_4_;
              fVar197 = local_be0._12_4_;
              auVar74._12_4_ = fVar197 * fVar34;
              fVar44 = auVar126._16_4_;
              fVar198 = local_be0._16_4_;
              auVar74._16_4_ = fVar198 * fVar44;
              fVar54 = auVar126._20_4_;
              fVar199 = local_be0._20_4_;
              auVar74._20_4_ = fVar199 * fVar54;
              fVar64 = auVar126._24_4_;
              fVar200 = local_be0._24_4_;
              auVar74._24_4_ = fVar200 * fVar64;
              auVar74._28_4_ = auVar124._12_4_;
              fVar140 = auVar130._0_4_;
              fVar168 = auVar125._0_4_;
              fVar15 = auVar130._4_4_;
              fVar173 = auVar125._4_4_;
              auVar75._4_4_ = fVar173 * fVar15;
              auVar75._0_4_ = fVar168 * fVar140;
              fVar25 = auVar130._8_4_;
              fVar174 = auVar125._8_4_;
              auVar75._8_4_ = fVar174 * fVar25;
              fVar35 = auVar130._12_4_;
              fVar175 = auVar125._12_4_;
              auVar75._12_4_ = fVar175 * fVar35;
              fVar45 = auVar130._16_4_;
              fVar176 = auVar125._16_4_;
              auVar75._16_4_ = fVar176 * fVar45;
              fVar55 = auVar130._20_4_;
              fVar177 = auVar125._20_4_;
              auVar75._20_4_ = fVar177 * fVar55;
              fVar65 = auVar130._24_4_;
              fVar178 = auVar125._24_4_;
              auVar75._24_4_ = fVar178 * fVar65;
              auVar75._28_4_ = auVar169._12_4_;
              local_b00 = vsubps_avx(auVar75,auVar74);
              fVar141 = auVar149._0_4_;
              fVar16 = auVar149._4_4_;
              auVar76._4_4_ = fVar173 * fVar16;
              auVar76._0_4_ = fVar168 * fVar141;
              fVar26 = auVar149._8_4_;
              auVar76._8_4_ = fVar174 * fVar26;
              fVar36 = auVar149._12_4_;
              auVar76._12_4_ = fVar175 * fVar36;
              fVar46 = auVar149._16_4_;
              auVar76._16_4_ = fVar176 * fVar46;
              fVar56 = auVar149._20_4_;
              auVar76._20_4_ = fVar177 * fVar56;
              fVar66 = auVar149._24_4_;
              uVar77 = local_b00._28_4_;
              auVar76._24_4_ = fVar178 * fVar66;
              auVar76._28_4_ = uVar77;
              fVar135 = local_ca0._0_4_;
              fVar17 = local_ca0._4_4_;
              auVar78._4_4_ = fVar14 * fVar17;
              auVar78._0_4_ = fVar139 * fVar135;
              fVar27 = local_ca0._8_4_;
              auVar78._8_4_ = fVar24 * fVar27;
              fVar37 = local_ca0._12_4_;
              auVar78._12_4_ = fVar34 * fVar37;
              fVar47 = local_ca0._16_4_;
              auVar78._16_4_ = fVar44 * fVar47;
              fVar57 = local_ca0._20_4_;
              auVar78._20_4_ = fVar54 * fVar57;
              fVar67 = local_ca0._24_4_;
              auVar78._24_4_ = fVar64 * fVar67;
              auVar78._28_4_ = auVar148._12_4_;
              auVar125 = vsubps_avx(auVar78,auVar76);
              auVar79._4_4_ = fVar15 * fVar17;
              auVar79._0_4_ = fVar140 * fVar135;
              auVar79._8_4_ = fVar25 * fVar27;
              auVar79._12_4_ = fVar35 * fVar37;
              auVar79._16_4_ = fVar45 * fVar47;
              auVar79._20_4_ = fVar55 * fVar57;
              auVar79._24_4_ = fVar65 * fVar67;
              auVar79._28_4_ = uVar77;
              auVar80._4_4_ = fVar195 * fVar16;
              auVar80._0_4_ = fVar191 * fVar141;
              auVar80._8_4_ = fVar196 * fVar26;
              auVar80._12_4_ = fVar197 * fVar36;
              auVar80._16_4_ = fVar198 * fVar46;
              auVar80._20_4_ = fVar199 * fVar56;
              auVar80._24_4_ = fVar200 * fVar66;
              auVar80._28_4_ = local_be0._28_4_;
              local_b40 = vsubps_avx(auVar80,auVar79);
              uVar117 = *(undefined4 *)&(ray->org).field_0;
              auVar193._4_4_ = uVar117;
              auVar193._0_4_ = uVar117;
              auVar193._8_4_ = uVar117;
              auVar193._12_4_ = uVar117;
              auVar193._16_4_ = uVar117;
              auVar193._20_4_ = uVar117;
              auVar193._24_4_ = uVar117;
              auVar193._28_4_ = uVar117;
              uVar117 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar201._4_4_ = uVar117;
              auVar201._0_4_ = uVar117;
              auVar201._8_4_ = uVar117;
              auVar201._12_4_ = uVar117;
              auVar201._16_4_ = uVar117;
              auVar201._20_4_ = uVar117;
              auVar201._24_4_ = uVar117;
              auVar201._28_4_ = uVar117;
              uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar204._4_4_ = uVar3;
              auVar204._0_4_ = uVar3;
              auVar204._8_4_ = uVar3;
              auVar204._12_4_ = uVar3;
              auVar204._16_4_ = uVar3;
              auVar204._20_4_ = uVar3;
              auVar204._24_4_ = uVar3;
              auVar204._28_4_ = uVar3;
              fVar127 = (ray->dir).field_0.m128[1];
              local_b20 = vsubps_avx(auVar160,auVar193);
              fVar136 = (ray->dir).field_0.m128[2];
              auVar74 = vsubps_avx(auVar162,auVar201);
              auVar75 = vsubps_avx(auVar166,auVar204);
              fVar137 = auVar75._0_4_;
              fVar18 = auVar75._4_4_;
              auVar81._4_4_ = fVar127 * fVar18;
              auVar81._0_4_ = fVar127 * fVar137;
              fVar28 = auVar75._8_4_;
              auVar81._8_4_ = fVar127 * fVar28;
              fVar38 = auVar75._12_4_;
              auVar81._12_4_ = fVar127 * fVar38;
              fVar48 = auVar75._16_4_;
              auVar81._16_4_ = fVar127 * fVar48;
              fVar58 = auVar75._20_4_;
              auVar81._20_4_ = fVar127 * fVar58;
              fVar68 = auVar75._24_4_;
              auVar81._24_4_ = fVar127 * fVar68;
              auVar81._28_4_ = uVar117;
              fVar134 = auVar74._0_4_;
              fVar19 = auVar74._4_4_;
              auVar82._4_4_ = fVar136 * fVar19;
              auVar82._0_4_ = fVar136 * fVar134;
              fVar29 = auVar74._8_4_;
              auVar82._8_4_ = fVar136 * fVar29;
              fVar39 = auVar74._12_4_;
              auVar82._12_4_ = fVar136 * fVar39;
              fVar49 = auVar74._16_4_;
              auVar82._16_4_ = fVar136 * fVar49;
              fVar59 = auVar74._20_4_;
              auVar82._20_4_ = fVar136 * fVar59;
              fVar69 = auVar74._24_4_;
              auVar82._24_4_ = fVar136 * fVar69;
              auVar82._28_4_ = uVar3;
              auVar74 = vsubps_avx(auVar82,auVar81);
              fVar138 = (ray->dir).field_0.m128[0];
              fVar10 = local_b20._0_4_;
              fVar20 = local_b20._4_4_;
              auVar83._4_4_ = fVar136 * fVar20;
              auVar83._0_4_ = fVar136 * fVar10;
              fVar30 = local_b20._8_4_;
              auVar83._8_4_ = fVar136 * fVar30;
              fVar40 = local_b20._12_4_;
              auVar83._12_4_ = fVar136 * fVar40;
              fVar50 = local_b20._16_4_;
              auVar83._16_4_ = fVar136 * fVar50;
              fVar60 = local_b20._20_4_;
              auVar83._20_4_ = fVar136 * fVar60;
              fVar70 = local_b20._24_4_;
              auVar83._24_4_ = fVar136 * fVar70;
              auVar83._28_4_ = uVar77;
              auVar84._4_4_ = fVar138 * fVar18;
              auVar84._0_4_ = fVar138 * fVar137;
              auVar84._8_4_ = fVar138 * fVar28;
              auVar84._12_4_ = fVar138 * fVar38;
              auVar84._16_4_ = fVar138 * fVar48;
              auVar84._20_4_ = fVar138 * fVar58;
              auVar84._24_4_ = fVar138 * fVar68;
              auVar84._28_4_ = auVar169._12_4_;
              auVar75 = vsubps_avx(auVar84,auVar83);
              auVar85._4_4_ = fVar138 * fVar19;
              auVar85._0_4_ = fVar138 * fVar134;
              auVar85._8_4_ = fVar138 * fVar29;
              auVar85._12_4_ = fVar138 * fVar39;
              auVar85._16_4_ = fVar138 * fVar49;
              auVar85._20_4_ = fVar138 * fVar59;
              auVar85._24_4_ = fVar138 * fVar69;
              auVar85._28_4_ = auVar169._12_4_;
              auVar86._4_4_ = fVar127 * fVar20;
              auVar86._0_4_ = fVar127 * fVar10;
              auVar86._8_4_ = fVar127 * fVar30;
              auVar86._12_4_ = fVar127 * fVar40;
              auVar86._16_4_ = fVar127 * fVar50;
              auVar86._20_4_ = fVar127 * fVar60;
              auVar86._24_4_ = fVar127 * fVar70;
              auVar86._28_4_ = local_b20._28_4_;
              auVar76 = vsubps_avx(auVar86,auVar85);
              fVar11 = local_b40._0_4_;
              fVar21 = local_b40._4_4_;
              fVar31 = local_b40._8_4_;
              fVar41 = local_b40._12_4_;
              fVar51 = local_b40._16_4_;
              fVar61 = local_b40._20_4_;
              fVar71 = local_b40._24_4_;
              fVar12 = auVar125._0_4_;
              fVar22 = auVar125._4_4_;
              fVar32 = auVar125._8_4_;
              fVar42 = auVar125._12_4_;
              fVar52 = auVar125._16_4_;
              fVar62 = auVar125._20_4_;
              fVar72 = auVar125._24_4_;
              fVar13 = local_b00._0_4_;
              fVar23 = local_b00._4_4_;
              fVar33 = local_b00._8_4_;
              fVar43 = local_b00._12_4_;
              fVar53 = local_b00._16_4_;
              fVar63 = local_b00._20_4_;
              fVar73 = local_b00._24_4_;
              auVar151._0_4_ = fVar138 * fVar13 + fVar127 * fVar12 + fVar136 * fVar11;
              auVar151._4_4_ = fVar138 * fVar23 + fVar127 * fVar22 + fVar136 * fVar21;
              auVar151._8_4_ = fVar138 * fVar33 + fVar127 * fVar32 + fVar136 * fVar31;
              auVar151._12_4_ = fVar138 * fVar43 + fVar127 * fVar42 + fVar136 * fVar41;
              auVar151._16_4_ = fVar138 * fVar53 + fVar127 * fVar52 + fVar136 * fVar51;
              auVar151._20_4_ = fVar138 * fVar63 + fVar127 * fVar62 + fVar136 * fVar61;
              auVar151._24_4_ = fVar138 * fVar73 + fVar127 * fVar72 + fVar136 * fVar71;
              auVar151._28_4_ = fVar136 + fVar136 + local_b20._28_4_;
              auVar131._8_4_ = 0x80000000;
              auVar131._0_8_ = 0x8000000080000000;
              auVar131._12_4_ = 0x80000000;
              auVar131._16_4_ = 0x80000000;
              auVar131._20_4_ = 0x80000000;
              auVar131._24_4_ = 0x80000000;
              auVar131._28_4_ = 0x80000000;
              auVar125 = vandps_avx(auVar151,auVar131);
              uVar106 = auVar125._0_4_;
              auVar164._0_4_ =
                   (float)(uVar106 ^
                          (uint)(fVar141 * auVar74._0_4_ +
                                fVar140 * auVar75._0_4_ + fVar139 * auVar76._0_4_));
              uVar181 = auVar125._4_4_;
              auVar164._4_4_ =
                   (float)(uVar181 ^
                          (uint)(fVar16 * auVar74._4_4_ +
                                fVar15 * auVar75._4_4_ + fVar14 * auVar76._4_4_));
              uVar182 = auVar125._8_4_;
              auVar164._8_4_ =
                   (float)(uVar182 ^
                          (uint)(fVar26 * auVar74._8_4_ +
                                fVar25 * auVar75._8_4_ + fVar24 * auVar76._8_4_));
              uVar183 = auVar125._12_4_;
              auVar164._12_4_ =
                   (float)(uVar183 ^
                          (uint)(fVar36 * auVar74._12_4_ +
                                fVar35 * auVar75._12_4_ + fVar34 * auVar76._12_4_));
              uVar184 = auVar125._16_4_;
              auVar164._16_4_ =
                   (float)(uVar184 ^
                          (uint)(fVar46 * auVar74._16_4_ +
                                fVar45 * auVar75._16_4_ + fVar44 * auVar76._16_4_));
              uVar185 = auVar125._20_4_;
              auVar164._20_4_ =
                   (float)(uVar185 ^
                          (uint)(fVar56 * auVar74._20_4_ +
                                fVar55 * auVar75._20_4_ + fVar54 * auVar76._20_4_));
              uVar186 = auVar125._24_4_;
              auVar164._24_4_ =
                   (float)(uVar186 ^
                          (uint)(fVar66 * auVar74._24_4_ +
                                fVar65 * auVar75._24_4_ + fVar64 * auVar76._24_4_));
              uVar187 = auVar125._28_4_;
              auVar164._28_4_ =
                   (float)(uVar187 ^ (uint)(auVar149._28_4_ + auVar130._28_4_ + auVar126._28_4_));
              auVar171._0_4_ =
                   (float)(uVar106 ^
                          (uint)(auVar74._0_4_ * fVar135 +
                                auVar75._0_4_ * fVar191 + fVar168 * auVar76._0_4_));
              auVar171._4_4_ =
                   (float)(uVar181 ^
                          (uint)(auVar74._4_4_ * fVar17 +
                                auVar75._4_4_ * fVar195 + fVar173 * auVar76._4_4_));
              auVar171._8_4_ =
                   (float)(uVar182 ^
                          (uint)(auVar74._8_4_ * fVar27 +
                                auVar75._8_4_ * fVar196 + fVar174 * auVar76._8_4_));
              auVar171._12_4_ =
                   (float)(uVar183 ^
                          (uint)(auVar74._12_4_ * fVar37 +
                                auVar75._12_4_ * fVar197 + fVar175 * auVar76._12_4_));
              auVar171._16_4_ =
                   (float)(uVar184 ^
                          (uint)(auVar74._16_4_ * fVar47 +
                                auVar75._16_4_ * fVar198 + fVar176 * auVar76._16_4_));
              auVar171._20_4_ =
                   (float)(uVar185 ^
                          (uint)(auVar74._20_4_ * fVar57 +
                                auVar75._20_4_ * fVar199 + fVar177 * auVar76._20_4_));
              auVar171._24_4_ =
                   (float)(uVar186 ^
                          (uint)(auVar74._24_4_ * fVar67 +
                                auVar75._24_4_ * fVar200 + fVar178 * auVar76._24_4_));
              auVar171._28_4_ = (float)(uVar187 ^ (uint)(auVar75._28_4_ + auVar76._28_4_ + -0.0));
              auVar149 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar125 = vcmpps_avx(auVar164,auVar149,5);
              auVar149 = vcmpps_avx(auVar171,auVar149,5);
              auVar125 = vandps_avx(auVar125,auVar149);
              auVar132._8_4_ = 0x7fffffff;
              auVar132._0_8_ = 0x7fffffff7fffffff;
              auVar132._12_4_ = 0x7fffffff;
              auVar132._16_4_ = 0x7fffffff;
              auVar132._20_4_ = 0x7fffffff;
              auVar132._24_4_ = 0x7fffffff;
              auVar132._28_4_ = 0x7fffffff;
              local_920 = vandps_avx(auVar151,auVar132);
              auVar149 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar151,4);
              auVar125 = vandps_avx(auVar125,auVar149);
              auVar133._0_4_ = auVar171._0_4_ + auVar164._0_4_;
              auVar133._4_4_ = auVar171._4_4_ + auVar164._4_4_;
              auVar133._8_4_ = auVar171._8_4_ + auVar164._8_4_;
              auVar133._12_4_ = auVar171._12_4_ + auVar164._12_4_;
              auVar133._16_4_ = auVar171._16_4_ + auVar164._16_4_;
              auVar133._20_4_ = auVar171._20_4_ + auVar164._20_4_;
              auVar133._24_4_ = auVar171._24_4_ + auVar164._24_4_;
              auVar133._28_4_ = auVar171._28_4_ + auVar164._28_4_;
              auVar130 = vcmpps_avx(auVar133,local_920,2);
              auVar149 = vandps_avx(auVar125,auVar130);
              auVar126 = local_a20 & auVar149;
              if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar126 >> 0x7f,0) != '\0') ||
                    (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar126 >> 0xbf,0) != '\0') ||
                  (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar126[0x1f] < '\0') {
                auVar149 = vandps_avx(auVar149,local_a20);
                local_940._0_4_ =
                     (float)(uVar106 ^ (uint)(fVar13 * fVar10 + fVar12 * fVar134 + fVar137 * fVar11)
                            );
                local_940._4_4_ =
                     (float)(uVar181 ^ (uint)(fVar23 * fVar20 + fVar22 * fVar19 + fVar18 * fVar21));
                local_940._8_4_ =
                     (float)(uVar182 ^ (uint)(fVar33 * fVar30 + fVar32 * fVar29 + fVar28 * fVar31));
                local_940._12_4_ =
                     (float)(uVar183 ^ (uint)(fVar43 * fVar40 + fVar42 * fVar39 + fVar38 * fVar41));
                local_940._16_4_ =
                     (float)(uVar184 ^ (uint)(fVar53 * fVar50 + fVar52 * fVar49 + fVar48 * fVar51));
                local_940._20_4_ =
                     (float)(uVar185 ^ (uint)(fVar63 * fVar60 + fVar62 * fVar59 + fVar58 * fVar61));
                local_940._24_4_ =
                     (float)(uVar186 ^ (uint)(fVar73 * fVar70 + fVar72 * fVar69 + fVar68 * fVar71));
                local_940._28_4_ =
                     uVar187 ^ (uint)(auVar130._28_4_ + auVar130._28_4_ + auVar125._28_4_);
                fVar127 = (ray->org).field_0.m128[3];
                fVar136 = local_920._0_4_;
                fVar138 = local_920._4_4_;
                auVar87._4_4_ = fVar138 * fVar127;
                auVar87._0_4_ = fVar136 * fVar127;
                fVar139 = local_920._8_4_;
                auVar87._8_4_ = fVar139 * fVar127;
                fVar140 = local_920._12_4_;
                auVar87._12_4_ = fVar140 * fVar127;
                fVar141 = local_920._16_4_;
                auVar87._16_4_ = fVar141 * fVar127;
                fVar135 = local_920._20_4_;
                auVar87._20_4_ = fVar135 * fVar127;
                fVar137 = local_920._24_4_;
                auVar87._24_4_ = fVar137 * fVar127;
                auVar87._28_4_ = fVar127;
                auVar125 = vcmpps_avx(auVar87,local_940,1);
                fVar127 = ray->tfar;
                auVar88._4_4_ = fVar138 * fVar127;
                auVar88._0_4_ = fVar136 * fVar127;
                auVar88._8_4_ = fVar139 * fVar127;
                auVar88._12_4_ = fVar140 * fVar127;
                auVar88._16_4_ = fVar141 * fVar127;
                auVar88._20_4_ = fVar135 * fVar127;
                auVar88._24_4_ = fVar137 * fVar127;
                auVar88._28_4_ = fVar127;
                auVar130 = vcmpps_avx(local_940,auVar88,2);
                auVar125 = vandps_avx(auVar130,auVar125);
                auVar130 = auVar149 & auVar125;
                if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar130 >> 0x7f,0) != '\0') ||
                      (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar130 >> 0xbf,0) != '\0') ||
                    (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar130[0x1f] < '\0') {
                  local_8e0 = vandps_avx(auVar149,auVar125);
                  auVar125 = vsubps_avx(local_920,auVar171);
                  local_980 = vblendvps_avx(auVar164,auVar125,local_9e0);
                  auVar125 = vsubps_avx(local_920,auVar164);
                  local_960 = vblendvps_avx(auVar171,auVar125,local_9e0);
                  local_860[0] = fVar13 * (float)local_a00._0_4_;
                  local_860[1] = fVar23 * (float)local_a00._4_4_;
                  local_860[2] = fVar33 * fStack_9f8;
                  local_860[3] = fVar43 * fStack_9f4;
                  fStack_850 = fVar53 * fStack_9f0;
                  fStack_84c = fVar63 * fStack_9ec;
                  fStack_848 = fVar73 * fStack_9e8;
                  fStack_844 = auVar171._28_4_;
                  local_840[0] = fVar12 * (float)local_a00._0_4_;
                  local_840[1] = fVar22 * (float)local_a00._4_4_;
                  local_840[2] = fVar32 * fStack_9f8;
                  local_840[3] = fVar42 * fStack_9f4;
                  fStack_830 = fVar52 * fStack_9f0;
                  fStack_82c = fVar62 * fStack_9ec;
                  fStack_828 = fVar72 * fStack_9e8;
                  fStack_824 = auVar171._28_4_;
                  auVar125 = vrcpps_avx(local_920);
                  local_820[0] = (float)local_a00._0_4_ * fVar11;
                  local_820[1] = (float)local_a00._4_4_ * fVar21;
                  local_820[2] = fStack_9f8 * fVar31;
                  local_820[3] = fStack_9f4 * fVar41;
                  fStack_810 = fStack_9f0 * fVar51;
                  fStack_80c = fStack_9ec * fVar61;
                  fStack_808 = fStack_9e8 * fVar71;
                  uStack_804 = uStack_9e4;
                  fVar127 = auVar125._0_4_;
                  fVar134 = auVar125._4_4_;
                  auVar89._4_4_ = fVar138 * fVar134;
                  auVar89._0_4_ = fVar136 * fVar127;
                  fVar136 = auVar125._8_4_;
                  auVar89._8_4_ = fVar139 * fVar136;
                  fVar138 = auVar125._12_4_;
                  auVar89._12_4_ = fVar140 * fVar138;
                  fVar139 = auVar125._16_4_;
                  auVar89._16_4_ = fVar141 * fVar139;
                  fVar140 = auVar125._20_4_;
                  auVar89._20_4_ = fVar135 * fVar140;
                  fVar141 = auVar125._24_4_;
                  auVar89._24_4_ = fVar137 * fVar141;
                  auVar89._28_4_ = uStack_9e4;
                  auVar161._8_4_ = 0x3f800000;
                  auVar161._0_8_ = &DAT_3f8000003f800000;
                  auVar161._12_4_ = 0x3f800000;
                  auVar161._16_4_ = 0x3f800000;
                  auVar161._20_4_ = 0x3f800000;
                  auVar161._24_4_ = 0x3f800000;
                  auVar161._28_4_ = 0x3f800000;
                  auVar125 = vsubps_avx(auVar161,auVar89);
                  fVar127 = fVar127 + fVar127 * auVar125._0_4_;
                  fVar134 = fVar134 + fVar134 * auVar125._4_4_;
                  fVar136 = fVar136 + fVar136 * auVar125._8_4_;
                  fVar138 = fVar138 + fVar138 * auVar125._12_4_;
                  fVar139 = fVar139 + fVar139 * auVar125._16_4_;
                  fVar140 = fVar140 + fVar140 * auVar125._20_4_;
                  fVar141 = fVar141 + fVar141 * auVar125._24_4_;
                  local_880._4_4_ = fVar134 * local_940._4_4_;
                  local_880._0_4_ = fVar127 * local_940._0_4_;
                  local_880._8_4_ = fVar136 * local_940._8_4_;
                  local_880._12_4_ = fVar138 * local_940._12_4_;
                  local_880._16_4_ = fVar139 * local_940._16_4_;
                  local_880._20_4_ = fVar140 * local_940._20_4_;
                  local_880._24_4_ = fVar141 * local_940._24_4_;
                  local_880._28_4_ = auVar125._28_4_;
                  local_8c0._4_4_ = local_980._4_4_ * fVar134;
                  local_8c0._0_4_ = local_980._0_4_ * fVar127;
                  local_8c0._8_4_ = local_980._8_4_ * fVar136;
                  local_8c0._12_4_ = local_980._12_4_ * fVar138;
                  local_8c0._16_4_ = local_980._16_4_ * fVar139;
                  local_8c0._20_4_ = local_980._20_4_ * fVar140;
                  local_8c0._24_4_ = local_980._24_4_ * fVar141;
                  local_8c0._28_4_ = local_980._28_4_;
                  local_8a0[0] = local_960._0_4_ * fVar127;
                  local_8a0[1] = local_960._4_4_ * fVar134;
                  local_8a0[2] = local_960._8_4_ * fVar136;
                  local_8a0[3] = local_960._12_4_ * fVar138;
                  fStack_890 = local_960._16_4_ * fVar139;
                  fStack_88c = local_960._20_4_ * fVar140;
                  fStack_888 = local_960._24_4_ * fVar141;
                  uStack_884 = local_960._28_4_;
                  uVar106 = vmovmskps_avx(local_8e0);
                  uVar108 = (ulong)uVar106;
                  _local_ae0 = auVar159;
                  _local_ad0 = auVar91;
                  _local_ac0 = auVar92;
                  _local_ab0 = auVar93;
                  _local_aa0 = auVar94;
                  _local_a90 = auVar95;
                  _local_a80 = auVar96;
                  _local_a70 = auVar97;
                  _local_a60 = auVar98;
                  _local_a50 = auVar99;
                  _local_a40 = auVar100;
                  do {
                    uVar110 = 0;
                    if (uVar108 != 0) {
                      for (; (uVar108 >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
                      }
                    }
                    local_c28 = *(uint *)((long)&local_9a0 + uVar110 * 4);
                    pGVar6 = (local_ca8->geometries).items[local_c28].ptr;
                    if ((pGVar6->mask & ray->mask) == 0) {
                      uVar108 = uVar108 ^ 1L << (uVar110 & 0x3f);
                      bVar90 = true;
                    }
                    else {
                      pRVar9 = context->args;
                      if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar90 = false;
                      }
                      else {
                        local_ca0._0_8_ = uVar108;
                        local_c10.context = context->user;
                        local_c40 = local_860[uVar110];
                        local_c3c = local_840[uVar110];
                        local_c38 = local_820[uVar110];
                        local_c34 = local_8a0[uVar110 - 8];
                        local_c30 = local_8a0[uVar110];
                        local_c2c = *(undefined4 *)((long)&local_9c0 + uVar110 * 4);
                        local_c24 = (local_c10.context)->instID[0];
                        local_c20 = (local_c10.context)->instPrimID[0];
                        local_be0._0_4_ = ray->tfar;
                        ray->tfar = local_860[uVar110 - 8];
                        local_cec = -1;
                        local_c10.valid = &local_cec;
                        local_c10.geometryUserPtr = pGVar6->userPtr;
                        local_c10.ray = (RTCRayN *)ray;
                        local_c10.hit = (RTCHitN *)&local_c40;
                        local_c10.N = 1;
                        if ((pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar6->occlusionFilterN)(&local_c10), *local_c10.valid != 0)) {
                          if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar9->filter)(&local_c10);
                            }
                            if (*local_c10.valid == 0) goto LAB_002df319;
                          }
                          bVar90 = false;
                        }
                        else {
LAB_002df319:
                          ray->tfar = (float)local_be0._0_4_;
                          local_ca0._0_8_ = local_ca0._0_8_ ^ 1L << (uVar110 & 0x3f);
                          bVar90 = true;
                        }
                        uVar108 = local_ca0._0_8_;
                      }
                    }
                    if (!bVar90) {
                      auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar165 = ZEXT1664(local_b50);
                      auVar167 = ZEXT1664(local_b60);
                      auVar172 = ZEXT1664(local_b70);
                      auVar180 = ZEXT1664(local_b80);
                      auVar189 = ZEXT1664(local_b90);
                      auVar190 = ZEXT1664(local_ba0);
                      auVar194 = ZEXT1664(local_bb0);
                      auVar202 = ZEXT1664(local_bc0);
                      iVar104 = 0;
                      uVar109 = local_ce0;
                      uVar108 = local_cc0;
                      uVar110 = local_cc8;
                      uVar112 = local_cd0;
                      uVar114 = local_cd8;
                      uVar120 = local_ce8;
                      if (bVar121) {
                        ray->tfar = -INFINITY;
                        iVar104 = 3;
                      }
                      goto LAB_002df3ce;
                    }
                  } while (uVar108 != 0);
                }
              }
              uVar109 = uVar109 + 1;
              bVar121 = uVar109 < local_c78;
              auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
            } while (uVar109 != local_c78);
            auVar165 = ZEXT1664(local_b50);
            auVar167 = ZEXT1664(local_b60);
            auVar172 = ZEXT1664(local_b70);
            auVar180 = ZEXT1664(local_b80);
            auVar189 = ZEXT1664(local_b90);
            auVar190 = ZEXT1664(local_ba0);
            auVar194 = ZEXT1664(local_bb0);
            auVar202 = ZEXT1664(local_bc0);
            iVar104 = 0;
            uVar109 = local_ce0;
            uVar108 = local_cc0;
            uVar110 = local_cc8;
            uVar112 = local_cd0;
            uVar114 = local_cd8;
            uVar120 = local_ce8;
          }
        }
LAB_002df3ce:
        unaff_R13 = local_cb8;
      } while (iVar104 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }